

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *fn;
  pointer pbVar1;
  pointer ppVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  pointer args_00;
  pointer __lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  findstr f;
  iter __end5;
  fileenumerator local_170;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
  local_150;
  ArgIterator __end1;
  string excludepaths;
  ArgIterator __begin1;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f.pattern._M_dataplus._M_p = (pointer)&f.pattern.field_2;
  f.matchcount = 0;
  f.searchtype = REGEX_SEARCH;
  f.matchword = false;
  f.matchbinary = false;
  f.matchcase = false;
  f.matchstart = false;
  f.firstmatch = false;
  f.pattern_is_hex = false;
  f.pattern_is_guid = false;
  f.verbose = 0;
  f.list_only = false;
  f.count_only = false;
  f.readcontinuous = false;
  f.use_sequential = false;
  f.maxfilesize = 0;
  f.nameprinted = false;
  f.pattern._M_string_length = 0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f.pattern.field_2._M_local_buf[0] = '\0';
  f.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f.bytemasks.
  super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  excludepaths._M_dataplus._M_p = (pointer)&excludepaths.field_2;
  excludepaths._M_string_length = 0;
  excludepaths.field_2._M_local_buf[0] = '\0';
  local_150.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
  .super__Tuple_impl<1UL,_fileenumerator::fileent>.
  super__Head_base<1UL,_fileenumerator::fileent,_false>._M_head_impl.ent._0_4_ = argc;
  local_150.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p = (pointer)argv;
  ArgParser::begin(&__begin1,(ArgParser *)&local_150);
  ArgParser::end(&__end1,(ArgParser *)&local_150);
  bVar4 = false;
  do {
    iVar6 = 1;
    if ((__begin1.i == __end1.i) && (__begin1.p == __end1.p)) {
      if (f.pattern._M_string_length == 0) {
        usage();
      }
      else {
        if (f.pattern_is_hex == true) {
          f.matchbinary = true;
          f.matchcase = true;
        }
        if (args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__begin1,"-",(allocator<char> *)&__end1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin1)
          ;
          std::__cxx11::string::~string((string *)&__begin1);
        }
        bVar3 = findstr::compile_pattern(&f);
        if (bVar3) {
          if (1 < f.verbose) {
            print<std::__cxx11::string&>("Compiled regex: %s\n",&f.pattern);
            ppVar2 = f.bytemasks.
                     super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (args_00 = f.bytemasks.
                           super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; args_00 != ppVar2;
                args_00 = args_00 + 1) {
              print<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ("Compiled bytes: %-b\n",&args_00->first);
              print<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                        ("Compiled  mask: %-b\n",&args_00->second);
            }
          }
          pbVar1 = args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          fn = &local_150.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          ;
          for (__lhs = args.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; iVar6 = 0, __lhs != pbVar1;
              __lhs = __lhs + 1) {
            bVar3 = std::operator==(__lhs,"-");
            if (bVar3) {
              findstr::searchstdin(&f);
            }
            else {
              iVar6 = stat((__lhs->_M_dataplus)._M_p,(stat *)&__begin1);
              if (iVar6 != -1) {
                if (((uint)__begin1.pend & 0xf000) == 0x4000) {
                  if (bVar4) {
                    fileenumerator::fileenumerator(&local_170,__lhs,1,SINGLE);
                    fileenumerator::begin((iter *)&__end1,&local_170);
                    __end5.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                    __end5._20_8_ = 0;
                    __end5.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    __end5.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
                    __end5.path._v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
                    __end5.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    __end5.cur.ent = (dirent *)0x0;
                    __end5.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    __end5.stack.super__Vector_base<__dirstream_*,_std::allocator<__dirstream_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    while (bVar3 = fileenumerator::iter::operator!=((iter *)&__end1,&__end5), bVar3)
                    {
                      fileenumerator::iter::operator*[abi_cxx11_(&local_150,(iter *)&__end1);
                      findstr::searchfile(&f,&fn->_M_head_impl);
                      std::__cxx11::string::~string((string *)fn);
                      fileenumerator::iter::nextent((iter *)&__end1);
                    }
                    fileenumerator::iter::~iter(&__end5);
                    fileenumerator::iter::~iter((iter *)&__end1);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_170);
                  }
                }
                else {
                  findstr::searchfile(&f,__lhs);
                }
              }
            }
          }
        }
      }
      goto LAB_00108ec0;
    }
    iVar5 = ArgParser::ArgIterator::option(&__begin1);
    switch(iVar5) {
    case 0x62:
      f.matchbinary = true;
      break;
    case 99:
      f.count_only = true;
      break;
    case 100:
    case 0x65:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
      goto switchD_00108b54_caseD_73;
    case 0x66:
      f.readcontinuous = true;
      break;
    case 0x67:
      f.pattern_is_guid = true;
      break;
    case 0x6c:
      f.list_only = true;
      break;
    default:
      switch(iVar5) {
      case 0x72:
        bVar4 = true;
        break;
      case 0x73:
      case 0x74:
      case 0x75:
        goto switchD_00108b54_caseD_73;
      case 0x76:
        iVar6 = ArgParser::ArgIterator::count(&__begin1);
        f.verbose = f.verbose + iVar6;
        break;
      case 0x77:
        f.matchword = true;
        break;
      case 0x78:
        f.pattern_is_hex = true;
        break;
      default:
        if (iVar5 == -1) {
          if (f.pattern._M_string_length != 0) {
            pcVar7 = ArgParser::ArgIterator::getstr(&__begin1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&__end5,pcVar7,(allocator<char> *)&local_170);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end5)
            ;
            goto LAB_00108c12;
          }
          pcVar7 = ArgParser::ArgIterator::getstr(&__begin1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&f.pattern,pcVar7);
        }
        else if (iVar5 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&__end5,"-",(allocator<char> *)&local_170);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end5);
LAB_00108c12:
          std::__cxx11::string::~string((string *)&__end5);
        }
        else if (iVar5 == 0x30) {
          f.matchstart = true;
        }
        else if (iVar5 == 0x31) {
          f.firstmatch = true;
        }
        else if (iVar5 == 0x49) {
          f.matchcase = true;
        }
        else if (iVar5 == 0x4d) {
          f.maxfilesize = ArgParser::ArgIterator::getint(&__begin1);
        }
        else if (iVar5 == 0x51) {
          f.use_sequential = true;
        }
        else {
          if (iVar5 != 0x53) {
switchD_00108b54_caseD_73:
            usage();
LAB_00108ec0:
            std::__cxx11::string::~string((string *)&excludepaths);
            findstr::~findstr(&f);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&args);
            return iVar6;
          }
          pcVar7 = ArgParser::ArgIterator::getstr(&__begin1);
          s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end5,
                       "regex",5);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__end5,pcVar7);
          std::__cxx11::string::~string((string *)&__end5);
          if (bVar3) {
            f._28_8_ = f._28_8_ & 0xffffffff;
          }
          else {
            s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end5,"std",3);
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__end5,pcVar7);
            std::__cxx11::string::~string((string *)&__end5);
            if (bVar3) {
              f.searchtype = STD_SEARCH;
            }
            else {
              s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__end5,"stdbm",5);
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&__end5,pcVar7);
              std::__cxx11::string::~string((string *)&__end5);
              if (bVar3) {
                f.searchtype = STD_BOYER_MOORE;
              }
              else {
                s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__end5,"stdbmh",6);
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&__end5,pcVar7);
                std::__cxx11::string::~string((string *)&__end5);
                if (bVar3) {
                  f.searchtype = STD_BOYER_MOORE_HORSPOOL;
                }
                else {
                  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__end5,"boostbm",7);
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&__end5,pcVar7);
                  std::__cxx11::string::~string((string *)&__end5);
                  if (bVar3) {
                    f.searchtype = BOOST_BOYER_MOORE;
                  }
                  else {
                    s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&__end5,"boostbmh",8);
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&__end5,pcVar7);
                    std::__cxx11::string::~string((string *)&__end5);
                    if (bVar3) {
                      f.searchtype = BOOST_BOYER_MOORE_HORSPOOL;
                    }
                    else {
                      s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&__end5,"boostkmp",8);
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&__end5,pcVar7);
                      std::__cxx11::string::~string((string *)&__end5);
                      if (bVar3) {
                        f.searchtype = BOOST_KNUTH_MORRIS_PRATT;
                      }
                      else {
                        s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&__end5,"mask",4);
                        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&__end5,pcVar7);
                        std::__cxx11::string::~string((string *)&__end5);
                        if (bVar3) {
                          f.searchtype = BYTEMASK_SEARCH;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    ArgParser::ArgIterator::operator++(&__begin1);
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    bool recurse_dirs = false;
    std::vector<std::string> args;
    findstr  f;
    std::string excludepaths;

    for (auto& arg : ArgParser(argc, argv))
        switch (arg.option())
        {
            case 'w': f.matchword = true; break;
            case 'b': f.matchbinary = true; break;
            case 'I': f.matchcase = true; break;
            case '0': f.matchstart = true; break;
            case '1': f.firstmatch = true; break;
            case 'x': f.pattern_is_hex = true; break;
            case 'g': f.pattern_is_guid = true; break;
            case 'v': f.verbose += arg.count(); break;
            case 'r': recurse_dirs = true; break;
            case 'l': f.list_only = true; break;
            case 'c': f.count_only = true; break;
            case 'f': f.readcontinuous = true; break;
            case 'M': f.maxfilesize = arg.getint(); break;
            //case 'X': excludepaths = arg.getstr(); break;
#ifdef WITH_MEMSEARCH
            case 'o': f.memoffset = arg.getint(); break;
            case 'L': f.memsize = arg.getint(); break;
            case 'h': f.pid = arg.getint(); break;
#endif
            case 'S': 
                      {
                      auto mode = arg.getstr();
                      if (mode == "regex"s) f.searchtype = REGEX_SEARCH;
                      else if (mode == "std"s) f.searchtype = STD_SEARCH;
                      else if (mode == "stdbm"s) f.searchtype = STD_BOYER_MOORE;
                      else if (mode == "stdbmh"s) f.searchtype = STD_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostbm"s) f.searchtype = BOOST_BOYER_MOORE;
                      else if (mode == "boostbmh"s) f.searchtype = BOOST_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostkmp"s) f.searchtype = BOOST_KNUTH_MORRIS_PRATT;
                      else if (mode == "mask"s) f.searchtype = BYTEMASK_SEARCH;
                      }
                      break;
            case 'Q': f.use_sequential = true; break;
            case 0:
                      args.push_back("-");
                      break;
            case -1:
                if (f.pattern.empty()) 
                    f.pattern = arg.getstr();
                else {
                    args.push_back(arg.getstr());
                }
                break;
            default:
                usage();
                return 1;
        }

    if (f.pattern.empty()) {
        usage();
        return 1;
    }
    if (f.pattern_is_hex) {
        f.matchbinary = true;
        f.matchcase = true;
    }
    //std::set<std::string> exclude;
    //for (auto i : tokenize(excludepaths, ':'))
    //    exclude.insert(i);

#ifdef WITH_MEMSEARCH
    if (!f.memoffset)
#endif
    if (args.empty())
        args.push_back("-");
    if (!f.compile_pattern())
        return 1;
    if (f.verbose > 1) {
        print("Compiled regex: %s\n", f.pattern);
        for (auto & bm : f.bytemasks) {
            print("Compiled bytes: %-b\n", bm.first);
            print("Compiled  mask: %-b\n", bm.second);
        }
    }
    bool stop = false;
#ifdef WITH_MEMSEARCH
    if (f.memoffset)
        catchall(f.searchmemory(), "memory");
#endif
    if (stop)
        return 0;

    for (auto const& arg : args) {
        if (arg == "-")
            f.searchstdin();
        else {
            struct stat st;
            if (-1 == stat(arg.c_str(), &st))
                continue;

            if ((st.st_mode & S_IFMT) == S_IFDIR) {
                if (recurse_dirs)
                    for (auto [fn, ent] : fileenumerator(arg))
                        catchall(f.searchfile(fn), fn);
            }
            //      [recurse_dirs,&exclude](const std::string& fn)->bool { 
            //          return exclude.find(fn)==exclude.end() && recurse_dirs;
            //      }
            else {
                catchall(f.searchfile(arg), arg);
            }
        }

        if (stop)
            return 0;
    }

    return 0;
}